

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  __uid_t _Var2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  char *pcVar6;
  int *piVar7;
  long lVar8;
  size_t __n;
  char *__dest;
  lafe_line_reader *plVar9;
  archive_entry_linkresolver *res;
  archive_entry *entry;
  cpio _cpio;
  char *errmsg;
  char *tptr;
  cpio_owner owner;
  archive_entry *local_200;
  cpio local_1f8;
  char *local_d0;
  char *local_c8;
  archive_entry *local_c0;
  _union_1457 local_b8;
  sigset_t local_b0;
  undefined4 local_30;
  
  memset(&local_1f8,0,0x128);
  local_1f8.buff = main::buff;
  local_1f8.buff_size = 0x4000;
  sigemptyset(&local_b0);
  local_30 = 0;
  local_b8 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_b8,(sigaction *)0x0);
  lafe_setprogname(*argv,"bsdcpio");
  pcVar6 = setlocale(6,"");
  if (pcVar6 == (char *)0x0) {
    lafe_warnc(0,"Failed to set default locale");
  }
  local_1f8.uid_override = -1;
  local_1f8.uname_override = (char *)0x0;
  local_1f8.gid_override = -1;
  local_1f8.gname_override = (char *)0x0;
  local_1f8.mode = 0;
  local_1f8.compress = 0;
  local_1f8.verbose = 0;
  local_1f8.extract_flags = L'𐽢';
  local_1f8.argc = argc;
  local_1f8.argv = argv;
  _Var2 = geteuid();
  if (_Var2 == 0) {
    local_1f8.extract_flags = local_1f8.extract_flags | 1;
  }
  local_1f8.bytes_per_block = 0x200;
  local_1f8.filename = (char *)0x0;
  local_1f8.matching = archive_match_new();
  if (local_1f8.matching == (archive *)0x0) {
    pcVar6 = "Out of memory";
LAB_0010a43e:
    lafe_errc(1,0,pcVar6);
  }
  iVar5 = local_1f8.bytes_per_block;
LAB_0010993e:
  local_1f8.bytes_per_block = iVar5;
  iVar3 = cpio_getopt(&local_1f8);
  iVar5 = local_1f8.bytes_per_block;
  switch(iVar3) {
  case 0x30:
    local_1f8.option_null = '\x01';
    goto LAB_0010993e;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x44:
  case 0x47:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x65:
  case 0x67:
  case 0x6b:
  case 0x71:
  case 0x73:
  case 0x77:
  case 0x78:
switchD_00109955_caseD_31:
    usage();
  case 0x36:
    local_1f8.option_pwb = 1;
    goto LAB_0010993e;
  case 0x37:
    local_1f8.format = "bin";
    goto LAB_0010993e;
  case 0x41:
    local_1f8.option_append = 1;
    goto LAB_0010993e;
  case 0x42:
    local_1f8.bytes_per_block = 0x1400;
    iVar5 = local_1f8.bytes_per_block;
    goto LAB_0010993e;
  case 0x43:
    piVar7 = __errno_location();
    *piVar7 = 0;
    local_c8 = (char *)0x0;
    lVar8 = strtol(local_1f8.argument,&local_c8,10);
    if ((((*piVar7 != 0) || ((int)lVar8 < 1)) || (*local_1f8.argument == '\0')) ||
       ((local_c8 == (char *)0x0 || (iVar5 = (int)lVar8, *local_c8 != '\0')))) {
      pcVar6 = "Invalid blocksize: %s";
      goto LAB_0010a3fa;
    }
    goto LAB_0010993e;
  case 0x45:
    wVar4 = archive_match_include_pattern_from_file
                      (local_1f8.matching,local_1f8.argument,(int)local_1f8.option_null);
    goto LAB_00109b4d;
  case 0x46:
  case 0x49:
  case 0x4f:
    local_1f8.filename = local_1f8.argument;
    goto LAB_0010993e;
  case 0x48:
    local_1f8.format = local_1f8.argument;
    goto LAB_0010993e;
  case 0x4a:
    local_1f8.compress = 0x4a;
    goto LAB_0010993e;
  case 0x4c:
    local_1f8.option_follow_links = 1;
    goto LAB_0010993e;
  case 0x52:
    local_d0 = (char *)0x0;
    iVar5 = owner_parse(local_1f8.argument,(cpio_owner *)&local_b8,&local_d0);
    if (iVar5 != 0) {
      if (local_d0 == (char *)0x0) {
        local_d0 = "Error parsing owner";
      }
      lafe_warnc(-1,"%s");
      usage();
    }
    if (local_b8._0_4_ != -1) {
      local_1f8.uid_override = local_b8._0_4_;
    }
    if ((char *)local_b0.__val[0] != (char *)0x0) {
      local_1f8.uname_override = (char *)local_b0.__val[0];
    }
    if (local_b8._4_4_ != -1) {
      local_1f8.gid_override = local_b8._4_4_;
    }
    iVar5 = local_1f8.bytes_per_block;
    if ((char *)local_b0.__val[1] != (char *)0x0) {
      local_1f8.gname_override = (char *)local_b0.__val[1];
    }
    goto LAB_0010993e;
  case 0x56:
    local_1f8.dot = local_1f8.dot + 1;
    goto LAB_0010993e;
  case 0x5a:
    local_1f8.compress = 0x5a;
    goto LAB_0010993e;
  case 0x61:
    local_1f8.option_atime_restore = 1;
    goto LAB_0010993e;
  case 99:
    local_1f8.format = "odc";
    goto LAB_0010993e;
  case 100:
    local_1f8.extract_flags = local_1f8.extract_flags & 0xfffffbff;
    goto LAB_0010993e;
  case 0x66:
    wVar4 = archive_match_exclude_pattern(local_1f8.matching,local_1f8.argument);
LAB_00109b4d:
    iVar5 = local_1f8.bytes_per_block;
    if (wVar4 != L'\0') goto LAB_0010a3dc;
    goto LAB_0010993e;
  case 0x68:
    long_help();
  case 0x69:
    if (local_1f8.mode == 0) {
      local_1f8.mode = 0x69;
      goto LAB_0010993e;
    }
    pcVar6 = "Cannot use both -i and -%c";
    break;
  case 0x6a:
    local_1f8.compress = 0x6a;
    goto LAB_0010993e;
  case 0x6c:
    local_1f8.option_link = 1;
    goto LAB_0010993e;
  case 0x6d:
    local_1f8.extract_flags = local_1f8.extract_flags | 4;
    goto LAB_0010993e;
  case 0x6e:
    local_1f8.option_numeric_uid_gid = 1;
    goto LAB_0010993e;
  case 0x6f:
    if (local_1f8.mode == 0) {
      local_1f8.mode = 0x6f;
      goto LAB_0010993e;
    }
    pcVar6 = "Cannot use both -o and -%c";
    break;
  case 0x70:
    if (local_1f8.mode == 0) {
      local_1f8.mode = 0x70;
      local_1f8.extract_flags = local_1f8.extract_flags & 0xfffefdff;
      goto LAB_0010993e;
    }
    pcVar6 = "Cannot use both -p and -%c";
    break;
  case 0x72:
    local_1f8.option_rename = 1;
    goto LAB_0010993e;
  case 0x74:
    local_1f8.option_list = 1;
    goto LAB_0010993e;
  case 0x75:
    local_1f8.extract_flags = local_1f8.extract_flags & 0xfffff7ff;
    goto LAB_0010993e;
  case 0x76:
    local_1f8.verbose = local_1f8.verbose + 1;
    goto LAB_0010993e;
  case 0x79:
    local_1f8.compress = 0x79;
    goto LAB_0010993e;
  case 0x7a:
    local_1f8.compress = 0x7a;
    goto LAB_0010993e;
  default:
    switch(iVar3) {
    default:
      goto switchD_00109955_caseD_31;
    case 1:
      local_1f8.add_filter = 1;
      break;
    case 2:
      local_1f8.compress = 2;
      break;
    case 3:
      local_1f8.extract_flags = local_1f8.extract_flags & 0xfffefcff;
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 0xe:
      local_1f8.compress = iVar3;
      break;
    case 8:
      local_1f8.passphrase = local_1f8.argument;
      break;
    case 9:
      local_1f8.extract_flags = local_1f8.extract_flags & 0xfffffffe;
      break;
    case 10:
      local_1f8.extract_flags = local_1f8.extract_flags | 1;
      break;
    case 0xb:
      local_1f8.quiet = 1;
      break;
    case 0xc:
      local_1f8.add_filter = 0xc;
      break;
    case 0xd:
      version();
    case -1:
      if (local_1f8.mode == 0 && local_1f8.option_list != 0) {
        local_1f8.mode = 0x69;
      }
      else {
        if (local_1f8.mode != 0x69 && local_1f8.option_list != 0) {
          pcVar6 = "Option -t requires -i";
          goto LAB_0010a43e;
        }
        if ((local_1f8.option_list == 0) && (local_1f8.option_numeric_uid_gid != 0)) {
          pcVar6 = "Option -n requires -it";
          goto LAB_0010a43e;
        }
      }
      if (local_1f8.mode != 0x6f && local_1f8.format != (char *)0x0) {
        pcVar6 = "Option --format requires -o";
        goto LAB_0010a43e;
      }
      if (local_1f8.mode != 0x70 && local_1f8.option_link != 0) {
        pcVar6 = "Option -l requires -p";
        goto LAB_0010a43e;
      }
      if ((local_1f8.dot != 0) && (local_1f8.verbose != 0)) {
        local_1f8.dot = 0;
      }
      if (local_1f8.mode == 0x6f) {
        if ((local_1f8.format == (char *)0x0) &&
           (local_1f8.format = "pwb", local_1f8.option_pwb == 0)) {
          local_1f8.format = "cpio";
        }
        if (local_1f8.option_append != 0) {
          pcVar6 = "Append mode not yet supported.";
          goto LAB_0010a43e;
        }
        local_1f8.archive_read_disk = archive_read_disk_new();
        if (local_1f8.archive_read_disk != (archive *)0x0) {
          if (local_1f8.option_follow_links == 0) {
            archive_read_disk_set_symlink_physical(local_1f8.archive_read_disk);
          }
          else {
            archive_read_disk_set_symlink_logical(local_1f8.archive_read_disk);
          }
          archive_read_disk_set_standard_lookup(local_1f8.archive_read_disk);
          local_1f8.archive = archive_write_new();
          if (local_1f8.archive != (archive *)0x0) {
            if (local_1f8.compress < 0x4a) {
              switch(local_1f8.compress) {
              case 2:
                wVar4 = archive_write_add_filter_grzip(local_1f8.archive);
                break;
              default:
switchD_00109eac_caseD_3:
                wVar4 = archive_write_add_filter_none(local_1f8.archive);
                break;
              case 4:
                wVar4 = archive_write_add_filter_lrzip(local_1f8.archive);
                break;
              case 5:
                wVar4 = archive_write_add_filter_lz4(local_1f8.archive);
                break;
              case 6:
                wVar4 = archive_write_add_filter_lzma(local_1f8.archive);
                break;
              case 7:
                wVar4 = archive_write_add_filter_lzop(local_1f8.archive);
                break;
              case 0xe:
                wVar4 = archive_write_add_filter_zstd(local_1f8.archive);
              }
            }
            else if (local_1f8.compress < 0x6a) {
              if (local_1f8.compress == 0x4a) {
                wVar4 = archive_write_add_filter_xz(local_1f8.archive);
              }
              else {
                if (local_1f8.compress != 0x5a) goto switchD_00109eac_caseD_3;
                wVar4 = archive_write_add_filter_compress(local_1f8.archive);
              }
            }
            else if ((local_1f8.compress == 0x6a) || (local_1f8.compress == 0x79)) {
              wVar4 = archive_write_add_filter_bzip2(local_1f8.archive);
            }
            else {
              if (local_1f8.compress != 0x7a) goto switchD_00109eac_caseD_3;
              wVar4 = archive_write_add_filter_gzip(local_1f8.archive);
            }
            if (wVar4 < L'\xffffffec') {
              pcVar6 = "Requested compression not available";
              goto LAB_0010a43e;
            }
            if (local_1f8.add_filter == 0xc) {
              wVar4 = archive_write_add_filter_uuencode(local_1f8.archive);
LAB_0010a045:
              if (wVar4 < L'\xffffffec') {
                pcVar6 = "Requested filter not available";
                goto LAB_0010a43e;
              }
            }
            else if (local_1f8.add_filter == 1) {
              wVar4 = archive_write_add_filter_b64encode(local_1f8.archive);
              goto LAB_0010a045;
            }
            iVar5 = archive_write_set_format_by_name(local_1f8.archive,local_1f8.format);
            if (iVar5 == 0) {
              archive_write_set_bytes_per_block(local_1f8.archive,local_1f8.bytes_per_block);
              res = archive_entry_linkresolver_new();
              local_1f8.linkresolver = res;
              iVar5 = archive_format(local_1f8.archive);
              archive_entry_linkresolver_set_strategy(res,iVar5);
              if (local_1f8.passphrase == (char *)0x0) {
                iVar5 = archive_write_set_passphrase_callback
                                  (local_1f8.archive,&local_1f8,passphrase_callback);
              }
              else {
                iVar5 = archive_write_set_passphrase(local_1f8.archive,local_1f8.passphrase);
              }
              if ((iVar5 == 0) &&
                 (wVar4 = archive_write_open_filename(local_1f8.archive,local_1f8.filename),
                 wVar4 == L'\0')) {
                plVar9 = lafe_line_reader("-",(int)local_1f8.option_null);
                pcVar6 = lafe_line_reader_next(plVar9);
                if (pcVar6 != (char *)0x0) {
                  do {
                    file_to_archive(&local_1f8,pcVar6);
                    pcVar6 = lafe_line_reader_next(plVar9);
                  } while (pcVar6 != (char *)0x0);
                }
                lafe_line_reader_free(plVar9);
                local_200 = (archive_entry *)0x0;
                archive_entry_linkify(local_1f8.linkresolver,&local_200,&local_c0);
                if (local_200 != (archive_entry *)0x0) {
                  do {
                    entry_to_archive(&local_1f8,local_200);
                    archive_entry_free(local_200);
                    local_200 = (archive_entry *)0x0;
                    archive_entry_linkify(local_1f8.linkresolver,&local_200,&local_c0);
                  } while (local_200 != (archive_entry *)0x0);
                }
                iVar5 = archive_write_close(local_1f8.archive);
                if (local_1f8.dot != 0) {
                  fputc(10,_stderr);
                }
                if (iVar5 == 0) {
                  if (local_1f8.quiet == 0) {
                    main_cold_2();
                  }
                  archive_write_free(local_1f8.archive);
                  archive_entry_linkresolver_free(local_1f8.linkresolver);
LAB_0010a202:
                  archive_match_free(local_1f8.matching);
                  free_cache(local_1f8.uname_cache);
                  free(local_1f8.uname_override);
                  free_cache(local_1f8.gname_cache);
                  free(local_1f8.gname_override);
                  archive_read_close(local_1f8.archive_read_disk);
                  archive_read_free(local_1f8.archive_read_disk);
                  free(local_1f8.destdir);
                  if (local_1f8.ppbuff != (char *)0x0) {
                    free(local_1f8.ppbuff);
                  }
                  return local_1f8.return_value;
                }
              }
            }
LAB_0010a347:
            local_1f8.argument = archive_error_string(local_1f8.archive);
            pcVar6 = "%s";
            goto LAB_0010a3fa;
          }
        }
      }
      else {
        if (local_1f8.mode != 0x70) {
          if (local_1f8.mode == 0x69) {
            pcVar6 = *local_1f8.argv;
            if (pcVar6 != (char *)0x0) goto LAB_0010a395;
            goto LAB_0010a3ce;
          }
          pcVar6 = "Must specify at least one of -i, -o, or -p";
          goto LAB_0010a43e;
        }
        pcVar6 = *local_1f8.argv;
        if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
          pcVar6 = "-p mode requires a target directory";
          goto LAB_0010a43e;
        }
        __n = strlen(pcVar6);
        local_1f8.destdir_len = __n;
        __dest = (char *)malloc(__n + 8);
        local_1f8.destdir = __dest;
        memcpy(__dest,pcVar6,__n);
        if ((__n == 0) || (pcVar6[__n - 1] != '/')) {
          __dest[__n] = '/';
          __n = __n + 1;
          local_1f8.destdir_len = __n;
        }
        __dest[__n] = '\0';
        local_1f8.archive = archive_write_disk_new();
        if (local_1f8.archive != (archive *)0x0) {
          wVar4 = archive_write_disk_set_options(local_1f8.archive,local_1f8.extract_flags);
          if (wVar4 != L'\0') goto LAB_0010a347;
          local_1f8.linkresolver = archive_entry_linkresolver_new();
          archive_write_disk_set_standard_lookup(local_1f8.archive);
          local_1f8.archive_read_disk = archive_read_disk_new();
          if (local_1f8.archive_read_disk != (archive *)0x0) {
            if (local_1f8.option_follow_links == 0) {
              archive_read_disk_set_symlink_physical(local_1f8.archive_read_disk);
            }
            else {
              archive_read_disk_set_symlink_logical(local_1f8.archive_read_disk);
            }
            archive_read_disk_set_standard_lookup(local_1f8.archive_read_disk);
            plVar9 = lafe_line_reader("-",(int)local_1f8.option_null);
            pcVar6 = lafe_line_reader_next(plVar9);
            if (pcVar6 != (char *)0x0) {
              do {
                file_to_archive(&local_1f8,pcVar6);
                pcVar6 = lafe_line_reader_next(plVar9);
              } while (pcVar6 != (char *)0x0);
            }
            lafe_line_reader_free(plVar9);
            archive_entry_linkresolver_free(local_1f8.linkresolver);
            iVar5 = archive_write_close(local_1f8.archive);
            if (local_1f8.dot != 0) {
              fputc(10,_stderr);
            }
            if (iVar5 == 0) {
              if (local_1f8.quiet == 0) {
                main_cold_1();
              }
              archive_write_free(local_1f8.archive);
              free(local_1f8.pass_destpath);
              goto LAB_0010a202;
            }
            goto LAB_0010a347;
          }
        }
      }
      pcVar6 = "Failed to allocate archive object";
      goto LAB_0010a43e;
    }
    goto LAB_0010993e;
  }
  lafe_errc(1,0,pcVar6);
LAB_0010a395:
  wVar4 = archive_match_include_pattern(local_1f8.matching,pcVar6);
  if (wVar4 != L'\0') {
LAB_0010a3dc:
    local_1f8.argument = archive_error_string(local_1f8.matching);
    pcVar6 = "Error : %s";
LAB_0010a3fa:
    lafe_errc(1,0,pcVar6,local_1f8.argument);
  }
  local_1f8.argc = local_1f8.argc + -1;
  ppcVar1 = local_1f8.argv + 1;
  pcVar6 = local_1f8.argv[1];
  local_1f8.argv = ppcVar1;
  if (pcVar6 == (char *)0x0) {
LAB_0010a3ce:
    if (local_1f8.option_list == 0) {
      mode_in(&local_1f8);
    }
    mode_list(&local_1f8);
  }
  goto LAB_0010a395;
}

Assistant:

int
main(int argc, char *argv[])
{
	static char buff[16384];
	struct cpio _cpio; /* Allocated on stack. */
	struct cpio *cpio;
	struct cpio_owner owner;
	const char *errmsg;
	char *tptr;
	int opt, t;

	cpio = &_cpio;
	memset(cpio, 0, sizeof(*cpio));
	cpio->buff = buff;
	cpio->buff_size = sizeof(buff);


#if defined(HAVE_SIGACTION) && defined(SIGPIPE)
	{ /* Ignore SIGPIPE signals. */
		struct sigaction sa;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sa.sa_handler = SIG_IGN;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/* Set lafe_progname before calling lafe_warnc. */
	lafe_setprogname(*argv, "bsdcpio");

#if HAVE_SETLOCALE
	if (setlocale(LC_ALL, "") == NULL)
		lafe_warnc(0, "Failed to set default locale");
#endif

	cpio->uid_override = -1;
	cpio->uname_override = NULL;
	cpio->gid_override = -1;
	cpio->gname_override = NULL;
	cpio->argv = argv;
	cpio->argc = argc;
	cpio->mode = '\0';
	cpio->verbose = 0;
	cpio->compress = '\0';
	cpio->extract_flags = ARCHIVE_EXTRACT_NO_AUTODIR;
	cpio->extract_flags |= ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_SYMLINKS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_NODOTDOT;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_PERM;
	cpio->extract_flags |= ARCHIVE_EXTRACT_FFLAGS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_ACL;
#if !defined(_WIN32) && !defined(__CYGWIN__)
	if (geteuid() == 0)
		cpio->extract_flags |= ARCHIVE_EXTRACT_OWNER;
#endif
	cpio->bytes_per_block = 512;
	cpio->filename = NULL;

	cpio->matching = archive_match_new();
	if (cpio->matching == NULL)
		lafe_errc(1, 0, "Out of memory");

	while ((opt = cpio_getopt(cpio)) != -1) {
		switch (opt) {
		case '0': /* GNU convention: --null, -0 */
			cpio->option_null = 1;
			break;
		case '6': /* in/out: assume/create 6th edition (PWB) format */
			cpio->option_pwb = 1;
			break;
		case '7': /* out: create archive using 7th Edition binary format */
			cpio->format = "bin";
			break;
		case 'A': /* NetBSD/OpenBSD */
			cpio->option_append = 1;
			break;
		case 'a': /* POSIX 1997 */
			cpio->option_atime_restore = 1;
			break;
		case 'B': /* POSIX 1997 */
			cpio->bytes_per_block = 5120;
			break;
		case OPTION_B64ENCODE:
			cpio->add_filter = opt;
			break;
		case 'C': /* NetBSD/OpenBSD */
			errno = 0;
			tptr = NULL;
			t = (int)strtol(cpio->argument, &tptr, 10);
			if (errno || t <= 0 || *(cpio->argument) == '\0' ||
			    tptr == NULL || *tptr != '\0') {
				lafe_errc(1, 0, "Invalid blocksize: %s",
				    cpio->argument);
			}
			cpio->bytes_per_block = t;
			break;
		case 'c': /* POSIX 1997 */
			cpio->format = "odc";
			break;
		case 'd': /* POSIX 1997 */
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_NO_AUTODIR;
			break;
		case 'E': /* NetBSD/OpenBSD */
			if (archive_match_include_pattern_from_file(
			    cpio->matching, cpio->argument,
			    cpio->option_null) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			break;
		case 'F': /* NetBSD/OpenBSD/GNU cpio */
			cpio->filename = cpio->argument;
			break;
		case 'f': /* POSIX 1997 */
			if (archive_match_exclude_pattern(cpio->matching,
			    cpio->argument) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			break;
		case OPTION_GRZIP:
			cpio->compress = opt;
			break;
		case 'H': /* GNU cpio (also --format) */
			cpio->format = cpio->argument;
			break;
		case 'h':
			long_help();
			/* NOTREACHED */
		case 'I': /* NetBSD/OpenBSD */
			cpio->filename = cpio->argument;
			break;
		case 'i': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -i and -%c", cpio->mode);
			cpio->mode = opt;
			break;
		case 'J': /* GNU tar, others */
			cpio->compress = opt;
			break;
		case 'j': /* GNU tar, others */
			cpio->compress = opt;
			break;
		case OPTION_INSECURE:
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_SYMLINKS;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NODOTDOT;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
			break;
		case 'L': /* GNU cpio */
			cpio->option_follow_links = 1;
			break;
		case 'l': /* POSIX 1997 */
			cpio->option_link = 1;
			break;
		case OPTION_LRZIP:
		case OPTION_LZ4:
		case OPTION_LZMA: /* GNU tar, others */
		case OPTION_LZOP: /* GNU tar, others */
		case OPTION_ZSTD:
			cpio->compress = opt;
			break;
		case 'm': /* POSIX 1997 */
			cpio->extract_flags |= ARCHIVE_EXTRACT_TIME;
			break;
		case 'n': /* GNU cpio */
			cpio->option_numeric_uid_gid = 1;
			break;
		case OPTION_NO_PRESERVE_OWNER: /* GNU cpio */
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_OWNER;
			break;
		case 'O': /* GNU cpio */
			cpio->filename = cpio->argument;
			break;
		case 'o': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -o and -%c", cpio->mode);
			cpio->mode = opt;
			break;
		case 'p': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -p and -%c", cpio->mode);
			cpio->mode = opt;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NODOTDOT;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
			break;
		case OPTION_PASSPHRASE:
			cpio->passphrase = cpio->argument;
			break;
		case OPTION_PRESERVE_OWNER:
			cpio->extract_flags |= ARCHIVE_EXTRACT_OWNER;
			break;
		case OPTION_QUIET: /* GNU cpio */
			cpio->quiet = 1;
			break;
		case 'R': /* GNU cpio, also --owner */
			errmsg = NULL;
			if (owner_parse(cpio->argument, &owner, &errmsg) != 0) {
				if (!errmsg)
					errmsg = "Error parsing owner";
				lafe_warnc(-1, "%s", errmsg);
				usage();
			}
			if (owner.uid != -1)
				cpio->uid_override = owner.uid;
			if (owner.uname != NULL)
				cpio->uname_override = owner.uname;
			if (owner.gid != -1)
				cpio->gid_override = owner.gid;
			if (owner.gname != NULL)
				cpio->gname_override = owner.gname;
			break;
		case 'r': /* POSIX 1997 */
			cpio->option_rename = 1;
			break;
		case 't': /* POSIX 1997 */
			cpio->option_list = 1;
			break;
		case 'u': /* POSIX 1997 */
			cpio->extract_flags
			    &= ~ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER;
			break;
		case OPTION_UUENCODE:
			cpio->add_filter = opt;
			break;
		case 'v': /* POSIX 1997 */
			cpio->verbose++;
			break;
		case 'V': /* GNU cpio */
			cpio->dot++;
			break;
		case OPTION_VERSION: /* GNU convention */
			version();
			/* NOTREACHED */
#if 0
	        /*
		 * cpio_getopt() handles -W specially, so it's not
		 * available here.
		 */
		case 'W': /* Obscure, but useful GNU convention. */
			break;
#endif
		case 'y': /* tar convention */
			cpio->compress = opt;
			break;
		case 'Z': /* tar convention */
			cpio->compress = opt;
			break;
		case 'z': /* tar convention */
			cpio->compress = opt;
			break;
		default:
			usage();
		}
	}

	/*
	 * Sanity-check args, error out on nonsensical combinations.
	 */
	/* -t implies -i if no mode was specified. */
	if (cpio->option_list && cpio->mode == '\0')
		cpio->mode = 'i';
	/* -t requires -i */
	if (cpio->option_list && cpio->mode != 'i')
		lafe_errc(1, 0, "Option -t requires -i");
	/* -n requires -it */
	if (cpio->option_numeric_uid_gid && !cpio->option_list)
		lafe_errc(1, 0, "Option -n requires -it");
	/* Can only specify format when writing */
	if (cpio->format != NULL && cpio->mode != 'o')
		lafe_errc(1, 0, "Option --format requires -o");
	/* -l requires -p */
	if (cpio->option_link && cpio->mode != 'p')
		lafe_errc(1, 0, "Option -l requires -p");
	/* -v overrides -V */
	if (cpio->dot && cpio->verbose)
		cpio->dot = 0;
	/* TODO: Flag other nonsensical combinations. */

	switch (cpio->mode) {
	case 'o':
		if (cpio->format == NULL) {
			if (cpio->option_pwb)
				cpio->format = "pwb";
			else
				cpio->format = "cpio";
		}
		mode_out(cpio);
		break;
	case 'i':
		while (*cpio->argv != NULL) {
			if (archive_match_include_pattern(cpio->matching,
			    *cpio->argv) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			--cpio->argc;
			++cpio->argv;
		}
		if (cpio->option_list)
			mode_list(cpio);
		else
			mode_in(cpio);
		/* NOTREACHED */
	case 'p':
		if (*cpio->argv == NULL || **cpio->argv == '\0')
			lafe_errc(1, 0,
			    "-p mode requires a target directory");
		mode_pass(cpio, *cpio->argv);
		break;
	default:
		lafe_errc(1, 0,
		    "Must specify at least one of -i, -o, or -p");
	}

	archive_match_free(cpio->matching);
	free_cache(cpio->uname_cache);
	free(cpio->uname_override);
	free_cache(cpio->gname_cache);
	free(cpio->gname_override);
	archive_read_close(cpio->archive_read_disk);
	archive_read_free(cpio->archive_read_disk);
	free(cpio->destdir);

	passphrase_free(cpio->ppbuff);
	return (cpio->return_value);
}